

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertLeHandlerShouldBeCalled_Test::~AssertionTest_assertLeHandlerShouldBeCalled_Test
          (AssertionTest_assertLeHandlerShouldBeCalled_Test *this)

{
  AssertionTest_assertLeHandlerShouldBeCalled_Test *this_local;
  
  AssertionTest::~AssertionTest(&this->super_AssertionTest);
  return;
}

Assistant:

TEST_F(AssertionTest, assertLeHandlerShouldBeCalled)
{
    std::int32_t a = 2;
    std::int32_t b = 1;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(1, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_LE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(2, assertionHandlerCounter_);
}